

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Menu.c
# Opt level: O3

int menu_screen(tgestate_t *state)

{
  attribute_t *paVar1;
  zxspectrum_t *pzVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint16_t uVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  undefined6 extraout_var;
  uint8_t *puVar11;
  keydefs_t *pkVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  keydefs_t *pkVar16;
  char cVar17;
  char cVar18;
  byte bVar19;
  char *pcharacter;
  uint uVar20;
  int iVar21;
  ushort *puVar22;
  byte *pcharacter_00;
  uint8_t speaker1;
  uint8_t speaker0;
  byte local_5e;
  byte local_5d;
  uint local_5c;
  keydefs_t *local_58;
  ushort *local_50;
  keydefs_t *local_48;
  long local_40;
  uint8_t *local_38;
  
  (*state->speccy->stamp)(state->speccy);
  bVar4 = (*state->speccy->in)(state->speccy,0xf7fe);
  if ((bVar4 & 0xf) == 0xf) {
    bVar4 = (*state->speccy->in)(state->speccy,0xeffe);
    cVar17 = -(bVar4 & 1);
LAB_0010bc68:
    if (cVar17 == '\0') {
      if (state->chosen_input_device != inputdevice_KEYBOARD) {
        return 2;
      }
      local_38 = (state->speccy->screen).pixels;
      local_40 = 0x47;
      local_58 = &state->keydefs;
      local_48 = (keydefs_t *)(state->locked_doors + 9);
LAB_0010befe:
      pzVar2 = state->speccy;
      iVar13 = state->rows;
      lVar15 = 0;
      do {
        memset((pzVar2->screen).pixels + game_window_start_offsets[lVar15],0,
               (long)state->columns - 1);
        lVar15 = lVar15 + 1;
      } while ((char)((char)iVar13 * '\b' + -8) != (char)lVar15);
      invalidate_bitmap(state,(pzVar2->screen).pixels + local_40,state->columns << 3,
                        state->rows * 8 + -8);
      set_game_window_attributes(state,'\a');
      cVar17 = '\x06';
      puVar22 = &choose_keys_choose_key_prompts;
      do {
        puVar11 = (state->speccy->screen).pixels + *puVar22;
        cVar18 = (char)puVar22[1];
        pcharacter = *(char **)(puVar22 + 4);
        do {
          puVar11 = plot_glyph(state,pcharacter,puVar11);
          pcharacter = pcharacter + 1;
          cVar18 = cVar18 + -1;
        } while (cVar18 != '\0');
        puVar22 = puVar22 + 8;
        cVar17 = cVar17 + -1;
      } while (cVar17 != '\0');
      local_58->defs[4].port = '\0';
      local_58->defs[4].mask = '\0';
      local_58->defs[0].port = '\0';
      local_58->defs[0].mask = '\0';
      local_58->defs[1].port = '\0';
      local_58->defs[1].mask = '\0';
      local_58->defs[2].port = '\0';
      local_58->defs[2].mask = '\0';
      local_58->defs[3].port = '\0';
      local_58->defs[3].mask = '\0';
      cVar17 = '\x05';
      puVar22 = &choose_keys_key_name_screen_offsets;
LAB_0010bfbd:
      uVar8 = *puVar22;
      iVar13 = menudelay(state,70000);
      if (iVar13 != 0) {
        return -1;
      }
      local_5c = CONCAT31(local_5c._1_3_,cVar17);
      local_50 = puVar22 + 1;
      bVar4 = 0xff;
LAB_0010bfec:
      bVar5 = 0xf7;
      bVar19 = 0;
      lVar15 = 0x10f7da;
      do {
        bVar6 = (*state->speccy->in)(state->speccy,(ushort)bVar5 << 8 | 0xfe);
        uVar14 = 0x20;
        while ((uVar14 & 1) == 0) {
          uVar14 = uVar14 >> 1;
          if ((byte)((byte)uVar14 & ~bVar6) != 0) {
            if (bVar4 != 0) goto LAB_0010c042;
            bVar4 = local_58->defs[0].port;
            pkVar12 = local_48;
            pkVar16 = local_58;
            if (bVar4 == 0) goto LAB_0010c09c;
            goto LAB_0010c06c;
          }
        }
        bVar19 = bVar19 + 1;
        bVar5 = *(byte *)(lVar15 + 1);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x10f7e2);
      bVar4 = 0;
LAB_0010c042:
      bVar5 = bVar4;
      iVar13 = menudelay(state,70000);
      goto LAB_0010c04f;
    }
    if (cVar17 == -1) goto LAB_0010bd36;
  }
  else {
    bVar4 = bVar4 & 0xf ^ 0xf;
    cVar17 = '\x01';
    do {
      if ((bVar4 & 1) != 0) goto LAB_0010bc68;
      bVar4 = bVar4 >> 1;
      cVar17 = cVar17 + '\x01';
    } while (cVar17 != '\x05');
    cVar17 = '\x04';
  }
  bVar4 = cVar17 - 1;
  pzVar2 = state->speccy;
  lVar15 = (long)state->width * (long)(int)state->chosen_input_device;
  builtin_memcpy((pzVar2->screen).attributes + lVar15 * 2 + 0x10d,"\a\a\a\a\a\a\a\a",8);
  paVar1 = (pzVar2->screen).attributes + lVar15 * 2 + 0x115;
  paVar1[0] = '\a';
  paVar1[1] = '\a';
  invalidate_attrs(state,(pzVar2->screen).attributes + lVar15 * 2 + 0x10d,0x50,8);
  state->chosen_input_device = (uint)bVar4;
  lVar15 = (long)state->width * (ulong)((uint)bVar4 + (uint)bVar4);
  builtin_memcpy((state->speccy->screen).attributes + lVar15 + 0x10d,"FFFFFFFFFF",10);
  invalidate_attrs(state,(state->speccy->screen).attributes + lVar15 + 0x10d,0x50,8);
LAB_0010bd36:
  wave_morale_flag(state);
  uVar9 = *(int *)&state->music_channel0_index + 1;
  do {
    state->music_channel0_index = (uint16_t)uVar9;
    uVar10 = uVar9 & 0xffff;
    uVar9 = 0;
  } while ("\x13"[uVar10] == 0xff);
  uVar7 = frequency_for_semitone("\x13"[uVar10],&local_5d);
  local_5c = (uint)CONCAT62(extraout_var,uVar7);
  uVar8 = state->music_channel1_index + 1;
  do {
    state->music_channel1_index = uVar8;
    uVar14 = (ulong)uVar8;
    uVar8 = 0;
  } while ("\n"[uVar14] == 0xff);
  uVar7 = frequency_for_semitone("\n"[uVar14],&local_5e);
  uVar9 = (uint)uVar7;
  if (0xfeff < uVar7) {
    uVar9 = local_5c;
  }
  cVar17 = '\x18';
  bVar4 = 0;
  local_50 = (ushort *)CONCAT44(local_50._4_4_,uVar9);
  uVar10 = local_5c;
  do {
    local_58 = (keydefs_t *)CONCAT71(local_58._1_7_,cVar17);
    cVar17 = -1;
    do {
      uVar10 = uVar10 & 0xffff;
      iVar13 = (uVar10 >> 8) + 0xff;
      if (((char)iVar13 == '\0') && (bVar5 = (char)uVar10 - 1, uVar10 = (uint)bVar5, bVar5 == 0)) {
        local_5d = local_5d ^ 0x10;
        bVar4 = local_5d & 0x10;
        (*state->speccy->out)(state->speccy,0xfe,local_5d);
        iVar21 = 2;
        uVar10 = local_5c;
      }
      else {
        iVar21 = 3;
        uVar10 = uVar10 & 0xff | iVar13 * 0x100;
      }
      uVar9 = uVar9 & 0xffff;
      iVar13 = (uVar9 >> 8) + 0xff;
      if (((char)iVar13 == '\0') && (bVar5 = (char)uVar9 - 1, uVar9 = (uint)bVar5, bVar5 == 0)) {
        local_5e = local_5e ^ 0x10;
        bVar4 = local_5e & 0x10;
        (*state->speccy->out)(state->speccy,0xfe,local_5e);
        iVar21 = iVar21 + -1;
        uVar9 = (uint)local_50;
      }
      else {
        uVar9 = uVar9 & 0xff | iVar13 * 0x100;
      }
      uVar20 = iVar21 + 1;
      do {
        (*state->speccy->out)(state->speccy,0xfe,bVar4);
        uVar20 = uVar20 - 1;
      } while (1 < uVar20);
      cVar17 = cVar17 + -1;
    } while (cVar17 != '\0');
    cVar17 = (char)local_58 + -1;
  } while (cVar17 != '\0');
  iVar13 = (*state->speccy->sleep)(state->speccy,0x4954d);
  return -(uint)(iVar13 != 0);
  while( true ) {
    bVar4 = pkVar16->defs[2].port;
    pkVar12 = (keydefs_t *)(pkVar16->defs + 1);
    if (bVar4 == 0) break;
LAB_0010c06c:
    pkVar16 = pkVar12;
    if ((bVar4 == bVar5) && ((uint)uVar14 == (uint)((keydefs_t *)(pkVar16->defs + 1))->defs[0].mask)
       ) goto LAB_0010c086;
  }
  pkVar16 = (keydefs_t *)(pkVar16->defs + 2);
LAB_0010c09c:
  pkVar16->defs[0].port = bVar5;
  *(byte *)((long)pkVar12->defs + 3) = (byte)uVar14;
  pcharacter_00 = &UNK_0010f80f + (ulong)bVar19 * 5;
  do {
    pcharacter_00 = pcharacter_00 + 1;
    uVar3 = uVar14 & 1;
    uVar14 = uVar14 >> 1;
  } while (uVar3 == 0);
  cVar17 = '\x01';
  if ((char)*pcharacter_00 < '\0') {
    uVar9 = *pcharacter_00 & 0x7f;
    pcharacter_00 = &UNK_0010f7f1 + uVar9;
    cVar17 = (&choose_keys_special_key_names)[uVar9];
  }
  puVar11 = local_38 + uVar8;
  do {
    puVar11 = plot_glyph(state,(char *)pcharacter_00,puVar11);
    pcharacter_00 = pcharacter_00 + 1;
    cVar17 = cVar17 + -1;
  } while (cVar17 != '\0');
  cVar17 = (char)local_5c + -1;
  puVar22 = local_50;
  if (cVar17 == '\0') goto LAB_0010c132;
  goto LAB_0010bfbd;
LAB_0010c086:
  iVar13 = menudelay(state,70000);
LAB_0010c04f:
  bVar4 = bVar5;
  if (iVar13 != 0) {
    return -1;
  }
  goto LAB_0010bfec;
LAB_0010c132:
  iVar13 = menudelay(state,350000);
  if (iVar13 != 0) {
    return -1;
  }
  iVar13 = user_confirm(state);
  if (iVar13 == 0) {
    return 2;
  }
  goto LAB_0010befe;
}

Assistant:

int menu_screen(tgestate_t *state)
{
  int      menu_keys_state;
  uint16_t counter_0;       /* was BC */
  uint16_t counter_1;       /* was BC' */
  uint16_t frequency_0;     /* was DE */
  uint16_t frequency_1;     /* was DE' */
  uint8_t  datum;           /* was A */
  uint8_t  major_delay;     /* was A */
  uint8_t  minor_delay;     /* was H */
  uint16_t channel0_index;  /* was HL */
  uint16_t channel1_index;  /* was HL' */
  uint8_t  speaker0;        /* was L */
  uint8_t  speaker1;        /* was L' */
  uint8_t  B;               /* was B */
  uint8_t  C;               /* was C */
  uint8_t  Bdash;           /* was B' */
  uint8_t  Cdash;           /* was C' */
  uint8_t  bit = 0; // most recently emitted bit

  assert(state != NULL);

  state->speccy->stamp(state->speccy);

  /* Conv: Menu driving loop was removed and the routine changed to return
   * non-zero when the game should begin. */
  menu_keys_state = check_menu_keys(state);
  if (menu_keys_state < 0 || menu_keys_state >= 2)
    return menu_keys_state; /* Start the game, or terminate the game thread */

  wave_morale_flag(state);

  /* Play music */

  channel0_index = state->music_channel0_index + 1;
  for (;;)
  {
    state->music_channel0_index = channel0_index;
    datum = music_channel0_data[channel0_index];
    if (datum != 0xFF) /* end marker */
      break;
    channel0_index = 0;
  }
  frequency_0 = counter_0 = frequency_for_semitone(datum, &speaker0);

  channel1_index = state->music_channel1_index + 1;
  for (;;)
  {
    state->music_channel1_index = channel1_index;
    datum = music_channel1_data[channel1_index];
    if (datum != 0xFF) /* end marker */
      break;
    channel1_index = 0;
  }
  frequency_1 = counter_1 = frequency_for_semitone(datum, &speaker1);

  /* When the second channel is silent use the first channel's frequency. */
  if ((counter_1 >> 8) == 0xFF) // (BCdash >> 8) was Bdash;
    frequency_1 = counter_1 = counter_0;

  major_delay = 24; /* overall tune speed (a delay: lower values are faster) */
  do
  {
    minor_delay = 255;
    do
    {
      int to_emit = 3; // Conv: Whatever we do always emit this many bits

      // B,C are a pair of counters? half pulse length?
      // B = lo, C = hi  (in this routine)

      B = counter_0 >> 8;
      C = counter_0 & 0xFF;
      if (--B == 0 && --C == 0)
      {
        speaker0 ^= port_MASK_EAR;
        bit = speaker0 & port_MASK_EAR;
        state->speccy->out(state->speccy, port_BORDER_EAR_MIC, speaker0);
        to_emit--;
        counter_0 = frequency_0;
      }
      else
      {
        counter_0 = (B << 8) | C;
      }

      Bdash = counter_1 >> 8;
      Cdash = counter_1 & 0xFF;
      if (--Bdash == 0 && --Cdash == 0)
      {
        speaker1 ^= port_MASK_EAR;
        bit = speaker1 & port_MASK_EAR;
        state->speccy->out(state->speccy, port_BORDER_EAR_MIC, speaker1);
        to_emit--;
        counter_1 = frequency_1;
      }
      else
      {
        counter_1 = (Bdash << 8) | Cdash;
      }

      /* Conv: We simulate the EAR port holding its level by adding extra
       * OUTs here. */
      // FIXME: The timing needs working out here: 3 OUTs per loop works,
      // but why?
      while (to_emit-- > 0)
        state->speccy->out(state->speccy, port_BORDER_EAR_MIC, bit);
    }
    while (--minor_delay);
  }
  while (--major_delay);

  /* Conv: Timing: Calibrated to original game. */
  if (state->speccy->sleep(state->speccy, 300365))
    return -1; /* Terminate the game thread */

  return 0; /* Don't start the game */
}